

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O0

void __thiscall QTcpServerPrivate::readNotification(QTcpServerPrivate *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  SocketError SVar4;
  QTcpServer *pQVar5;
  ulong uVar6;
  QAbstractSocketEngine *this_00;
  QTcpServerPrivate *in_RDI;
  long in_FS_OFFSET;
  qintptr descriptor;
  QTcpServer *q;
  QPointer<QTcpServer> that;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = q_func(in_RDI);
  do {
    iVar3 = (**(code **)(*(long *)in_RDI + 0x28))();
    if (in_RDI->maxConnections <= iVar3) {
      uVar6 = (**(code **)(*(long *)in_RDI->socketEngine + 0x138))();
      if ((uVar6 & 1) != 0) {
        (**(code **)(*(long *)in_RDI->socketEngine + 0x140))(in_RDI->socketEngine,0);
      }
LAB_0026227e:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    this_00 = (QAbstractSocketEngine *)(**(code **)(*(long *)in_RDI->socketEngine + 0xa0))();
    if (this_00 == (QAbstractSocketEngine *)0xffffffffffffffff) {
      SVar4 = QAbstractSocketEngine::error((QAbstractSocketEngine *)0x26216e);
      if (SVar4 != TemporaryError) {
        QTcpServer::pauseAccepting((QTcpServer *)0x26217d);
        SVar4 = QAbstractSocketEngine::error((QAbstractSocketEngine *)0x26218d);
        in_RDI->serverSocketError = SVar4;
        QAbstractSocketEngine::errorString(this_00);
        QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           (QString *)in_RDI);
        SVar4 = (SocketError)((ulong)in_RDI >> 0x20);
        QString::~QString((QString *)0x2621c9);
        QTcpServer::acceptError((QTcpServer *)0x2621dd,SVar4);
      }
      goto LAB_0026227e;
    }
    QPointer<QTcpServer>::QPointer<void>
              ((QPointer<QTcpServer> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
               ,(QTcpServer *)in_RDI);
    (**(code **)(*(long *)pQVar5 + 0x70))(pQVar5,this_00);
    bVar2 = QPointer::operator_cast_to_bool((QPointer<QTcpServer> *)0x262223);
    if (bVar2) {
      QTcpServer::newConnection((QTcpServer *)0x262233);
    }
    bVar2 = QPointer::operator_cast_to_bool((QPointer<QTcpServer> *)0x26223d);
    if ((bVar2) && (bVar2 = QTcpServer::isListening((QTcpServer *)in_RDI), bVar2)) {
      iVar3 = 0;
    }
    else {
      iVar3 = 1;
    }
    QPointer<QTcpServer>::~QPointer((QPointer<QTcpServer> *)0x26226d);
    if (iVar3 != 0) goto LAB_0026227e;
    in_stack_ffffffffffffffb4 = 0;
  } while( true );
}

Assistant:

void QTcpServerPrivate::readNotification()
{
    Q_Q(QTcpServer);
    for (;;) {
        if (totalPendingConnections() >= maxConnections) {
#if defined (QTCPSERVER_DEBUG)
            qDebug("QTcpServerPrivate::_q_processIncomingConnection() too many connections");
#endif
            if (socketEngine->isReadNotificationEnabled())
                socketEngine->setReadNotificationEnabled(false);
            return;
        }

        qintptr descriptor = socketEngine->accept();
        if (descriptor == -1) {
            if (socketEngine->error() != QAbstractSocket::TemporaryError) {
                q->pauseAccepting();
                serverSocketError = socketEngine->error();
                serverSocketErrorString = socketEngine->errorString();
                emit q->acceptError(serverSocketError);
            }
            break;
        }
#if defined (QTCPSERVER_DEBUG)
        qDebug("QTcpServerPrivate::_q_processIncomingConnection() accepted socket %i", descriptor);
#endif
        QPointer<QTcpServer> that = q;
        q->incomingConnection(descriptor);

        if (that)
            emit q->newConnection();

        if (!that || !q->isListening())
            return;
    }
}